

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorSet::SerializeWithCachedSizes
          (FileDescriptorSet *this,CodedOutputStream *output)

{
  uint uVar1;
  FileDescriptorProto *value;
  UnknownFieldSet *unknown_fields;
  uint local_30;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  FileDescriptorSet *this_local;
  
  local_30 = 0;
  uVar1 = file_size(this);
  for (; local_30 < uVar1; local_30 = local_30 + 1) {
    value = file(this,local_30);
    internal::WireFormatLite::WriteMessageMaybeToArray(1,(MessageLite *)value,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = FileDescriptorSet::unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void FileDescriptorSet::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.FileDescriptorSet)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .google.protobuf.FileDescriptorProto file = 1;
  for (unsigned int i = 0, n = this->file_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      1, this->file(i), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.FileDescriptorSet)
}